

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

int xcb_input_set_device_valuators_sizeof(void *_buffer)

{
  uint xcb_align_to;
  uint xcb_pad;
  uint xcb_block_len;
  uint xcb_buffer_len;
  xcb_input_set_device_valuators_request_t *_aux;
  char *xcb_tmp;
  void *_buffer_local;
  
  return (uint)*(byte *)((long)_buffer + 6) * 4 + 8;
}

Assistant:

int
xcb_input_set_device_valuators_sizeof (const void  *_buffer)
{
    char *xcb_tmp = (char *)_buffer;
    const xcb_input_set_device_valuators_request_t *_aux = (xcb_input_set_device_valuators_request_t *)_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_block_len = 0;
    unsigned int xcb_pad = 0;
    unsigned int xcb_align_to = 0;


    xcb_block_len += sizeof(xcb_input_set_device_valuators_request_t);
    xcb_tmp += xcb_block_len;
    xcb_buffer_len += xcb_block_len;
    xcb_block_len = 0;
    /* valuators */
    xcb_block_len += _aux->num_valuators * sizeof(int32_t);
    xcb_tmp += xcb_block_len;
    xcb_align_to = ALIGNOF(int32_t);
    /* insert padding */
    xcb_pad = -xcb_block_len & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_tmp += xcb_pad;
        xcb_pad = 0;
    }
    xcb_block_len = 0;

    return xcb_buffer_len;
}